

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O3

int Cnf_DataSolveFromFile
              (char *pFileName,int nConfLimit,int nLearnedStart,int nLearnedDelta,int nLearnedPerce,
              int fVerbose,int fShowPattern,int **ppModel,int nPis)

{
  bool bVar1;
  int iVar2;
  Cnf_Dat_t *p;
  sat_solver *s;
  int *piVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  char *format;
  int iVar7;
  sat_solver *psVar8;
  FILE *pFVar9;
  long lVar10;
  long lVar11;
  int local_50;
  timespec local_48;
  int local_34;
  
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p = Cnf_DataReadFromFile(pFileName);
  if (p == (Cnf_Dat_t *)0x0) {
    return -1;
  }
  local_34 = nConfLimit;
  if (fVerbose != 0) {
    printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)p->nVars,
           (ulong)(uint)p->nClauses,(ulong)(uint)p->nLiterals);
    iVar7 = 3;
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar7,"%s =","Time");
    Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar11 - lVar10) / 1000000.0);
  }
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  if (s == (sat_solver *)0x0) {
    puts("The problem is trivially UNSAT.");
    Cnf_DataFree(p);
    return 1;
  }
  if (nLearnedStart != 0) {
    s->nLearntMax = nLearnedStart;
    s->nLearntStart = nLearnedStart;
  }
  if (nLearnedDelta != 0) {
    s->nLearntDelta = nLearnedDelta;
  }
  if (nLearnedPerce != 0) {
    s->nLearntRatio = nLearnedPerce;
  }
  if (fVerbose != 0) {
    s->fVerbose = fVerbose;
  }
  psVar8 = s;
  iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)local_34,0,0,0);
  iVar7 = (int)psVar8;
  if (iVar2 == 0) {
    local_50 = -1;
  }
  else {
    local_50 = 0;
    bVar1 = true;
    if (iVar2 == 1) goto LAB_0055f78d;
    if (iVar2 != -1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfUtil.c"
                    ,0x1bb,
                    "int Cnf_DataSolveFromFile(char *, int, int, int, int, int, int, int **, int)");
    }
    local_50 = 1;
  }
  bVar1 = false;
LAB_0055f78d:
  if (fVerbose != 0) {
    pFVar9 = _stdout;
    Sat_SolverPrintStats(_stdout,s);
    iVar7 = (int)pFVar9;
  }
  pcVar4 = "UNSATISFIABLE  ";
  if (bVar1) {
    pcVar4 = "SATISFIABLE    ";
  }
  format = "UNDECIDED      ";
  if (iVar2 != 0) {
    format = pcVar4;
  }
  Abc_Print(iVar7,format);
  iVar7 = 3;
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar11 - lVar10) / 1000000.0);
  if (0 < nPis && !(bool)(bVar1 ^ 1U)) {
    piVar3 = (int *)malloc((ulong)(uint)nPis * 4);
    *ppModel = piVar3;
    uVar5 = (ulong)(uint)(p->nVars - nPis);
    uVar6 = 0;
    do {
      if (((int)uVar5 < 0) || (s->size <= (int)uVar5)) goto LAB_0055f92b;
      piVar3[uVar6] = (uint)(s->model[uVar5] == 1);
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + 1;
    } while ((uint)nPis != uVar6);
  }
  if (fShowPattern != 0 && !(bool)(bVar1 ^ 1U)) {
    if (0 < p->nVars) {
      lVar10 = 0;
      do {
        if (s->size <= lVar10) {
LAB_0055f92b:
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        printf("%d",(ulong)(s->model[lVar10] == 1));
        lVar10 = lVar10 + 1;
      } while (lVar10 < p->nVars);
    }
    putchar(10);
  }
  Cnf_DataFree(p);
  sat_solver_delete(s);
  return local_50;
}

Assistant:

int Cnf_DataSolveFromFile( char * pFileName, int nConfLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fVerbose, int fShowPattern, int ** ppModel, int nPis )
{
    abctime clk = Abc_Clock();
    Cnf_Dat_t * pCnf = Cnf_DataReadFromFile( pFileName );
    sat_solver * pSat;
    int i, status, RetValue = -1;
    if ( pCnf == NULL )
        return -1;
    if ( fVerbose )
    {
        printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    // convert into SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        printf( "The problem is trivially UNSAT.\n" );
        Cnf_DataFree( pCnf );
        return 1;
    }
    if ( nLearnedStart )
        pSat->nLearntStart = pSat->nLearntMax = nLearnedStart;
    if ( nLearnedDelta )
        pSat->nLearntDelta = nLearnedDelta;
    if ( nLearnedPerce )
        pSat->nLearntRatio = nLearnedPerce;
    if ( fVerbose )
        pSat->fVerbose = fVerbose;

//sat_solver_start_cardinality( pSat, 100 );

    // solve the miter
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_Undef )
        RetValue = -1;
    else if ( status == l_True )
        RetValue = 0;
    else if ( status == l_False )
        RetValue = 1;
    else
        assert( 0 );
    if ( fVerbose )
        Sat_SolverPrintStats( stdout, pSat );
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // derive SAT assignment
    if ( RetValue == 0 && nPis > 0 )
    {
        *ppModel = ABC_ALLOC( int, nPis );
        for ( i = 0; i < nPis; i++ )
            (*ppModel)[i] = sat_solver_var_value( pSat, pCnf->nVars - nPis + i );
    }
    if ( RetValue == 0 && fShowPattern )
    {
        for ( i = 0; i < pCnf->nVars; i++ )
            printf( "%d", sat_solver_var_value(pSat,i) );
        printf( "\n" );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    return RetValue;
}